

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::ColladaExporter
          (ColladaExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file)

{
  locale local_58 [8];
  locale local_50 [31];
  allocator<char> local_31;
  string *local_30;
  string *file_local;
  string *path_local;
  IOSystem *pIOSystem_local;
  aiScene *pScene_local;
  ColladaExporter *this_local;
  
  this->_vptr_ColladaExporter = (_func_int **)&PTR__ColladaExporter_011258f0;
  local_30 = file;
  file_local = path;
  path_local = (string *)pIOSystem;
  pIOSystem_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->mFoundSkeletonRootNodeID,"skeleton_root",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->mOutput);
  this->mIOSystem = (IOSystem *)path_local;
  std::__cxx11::string::string((string *)&this->mPath,(string *)file_local);
  std::__cxx11::string::string((string *)&this->mFile,(string *)local_30);
  std::__cxx11::string::string((string *)&this->startstr);
  std::__cxx11::string::string((string *)&this->endstr);
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::vector(&this->materials);
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->textures);
  std::locale::locale(local_58,"C");
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale(local_58);
  std::ios_base::precision
            ((ios_base *)(&this->mOutput + *(long *)(*(long *)&this->mOutput + -0x18)),8);
  this->mScene = (aiScene *)pIOSystem_local;
  this->mSceneOwned = false;
  std::__cxx11::string::operator=((string *)&this->endstr,"\n");
  WriteFile(this);
  return;
}

Assistant:

ColladaExporter::ColladaExporter( const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file) 
: mIOSystem(pIOSystem)
, mPath(path)
, mFile(file) {
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    mScene = pScene;
    mSceneOwned = false;

    // set up strings
    endstr = "\n";

    // start writing the file
    WriteFile();
}